

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimerManager.cpp
# Opt level: O0

void __thiscall ztimer::TimerManager::Turn(TimerManager *this,uint pos)

{
  value_type vVar1;
  bool bVar2;
  reference pvVar3;
  uint in_ESI;
  long in_RDI;
  Timer *timer;
  iterator iter;
  undefined4 in_stack_fffffffffffffee8;
  value_type in_stack_fffffffffffffeec;
  unordered_map<unsigned_long,_unsigned_int,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_int>_>_>
  *in_stack_fffffffffffffef0;
  _Node_iterator_base<std::pair<const_unsigned_long,_std::array<unsigned_int,_3UL>_>,_false>
  in_stack_fffffffffffffef8;
  Timer **in_stack_ffffffffffffff58;
  type *in_stack_ffffffffffffff60;
  launch in_stack_ffffffffffffff6c;
  _Node_iterator_base<std::pair<const_unsigned_long,_std::array<unsigned_int,_3UL>_>,_false>
  local_20;
  _Node_iterator_base<std::pair<const_unsigned_long,_std::array<unsigned_int,_3UL>_>,_false>
  local_18;
  uint local_c;
  
  local_c = in_ESI;
  std::
  vector<std::unordered_map<unsigned_long,_std::array<unsigned_int,_3UL>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::array<unsigned_int,_3UL>_>_>_>,_std::allocator<std::unordered_map<unsigned_long,_std::array<unsigned_int,_3UL>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::array<unsigned_int,_3UL>_>_>_>_>_>
  ::operator[]((vector<std::unordered_map<unsigned_long,_std::array<unsigned_int,_3UL>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::array<unsigned_int,_3UL>_>_>_>,_std::allocator<std::unordered_map<unsigned_long,_std::array<unsigned_int,_3UL>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::array<unsigned_int,_3UL>_>_>_>_>_>
                *)(in_RDI + 8),(ulong)in_ESI);
  local_18._M_cur =
       (__node_type *)
       std::
       unordered_map<unsigned_long,_std::array<unsigned_int,_3UL>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::array<unsigned_int,_3UL>_>_>_>
       ::begin((unordered_map<unsigned_long,_std::array<unsigned_int,_3UL>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::array<unsigned_int,_3UL>_>_>_>
                *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
  while( true ) {
    std::
    vector<std::unordered_map<unsigned_long,_std::array<unsigned_int,_3UL>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::array<unsigned_int,_3UL>_>_>_>,_std::allocator<std::unordered_map<unsigned_long,_std::array<unsigned_int,_3UL>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::array<unsigned_int,_3UL>_>_>_>_>_>
    ::operator[]((vector<std::unordered_map<unsigned_long,_std::array<unsigned_int,_3UL>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::array<unsigned_int,_3UL>_>_>_>,_std::allocator<std::unordered_map<unsigned_long,_std::array<unsigned_int,_3UL>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::array<unsigned_int,_3UL>_>_>_>_>_>
                  *)(in_RDI + 8),(ulong)local_c);
    local_20._M_cur =
         (__node_type *)
         std::
         unordered_map<unsigned_long,_std::array<unsigned_int,_3UL>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::array<unsigned_int,_3UL>_>_>_>
         ::end((unordered_map<unsigned_long,_std::array<unsigned_int,_3UL>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::array<unsigned_int,_3UL>_>_>_>
                *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
    bVar2 = std::__detail::operator!=(&local_18,&local_20);
    if (!bVar2) break;
    std::__detail::
    _Node_iterator<std::pair<const_unsigned_long,_std::array<unsigned_int,_3UL>_>,_false,_false>::
    operator->((_Node_iterator<std::pair<const_unsigned_long,_std::array<unsigned_int,_3UL>_>,_false,_false>
                *)0x17fc37);
    pvVar3 = std::array<unsigned_int,_3UL>::operator[]
                       ((array<unsigned_int,_3UL> *)in_stack_fffffffffffffef0,
                        CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
    vVar1 = *pvVar3;
    *pvVar3 = vVar1 - 1;
    if (vVar1 == 0) {
      std::__detail::
      _Node_iterator<std::pair<const_unsigned_long,_std::array<unsigned_int,_3UL>_>,_false,_false>::
      operator->((_Node_iterator<std::pair<const_unsigned_long,_std::array<unsigned_int,_3UL>_>,_false,_false>
                  *)0x17fc6f);
      std::__detail::
      _Node_iterator<std::pair<const_unsigned_long,_std::array<unsigned_int,_3UL>_>,_false,_false>::
      operator->((_Node_iterator<std::pair<const_unsigned_long,_std::array<unsigned_int,_3UL>_>,_false,_false>
                  *)0x17fc84);
      pvVar3 = std::array<unsigned_int,_3UL>::operator[]
                         ((array<unsigned_int,_3UL> *)in_stack_fffffffffffffef0,
                          CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
      vVar1 = *pvVar3;
      if (vVar1 == 0) {
        std::async<void(ztimer::Timer::*)(),ztimer::Timer*&>
                  (in_stack_ffffffffffffff6c,in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
        std::future<void>::~future((future<void> *)0x17fdb3);
        std::__detail::
        _Node_iterator<std::pair<const_unsigned_long,_std::array<unsigned_int,_3UL>_>,_false,_false>
        ::operator->((_Node_iterator<std::pair<const_unsigned_long,_std::array<unsigned_int,_3UL>_>,_false,_false>
                      *)0x17fdce);
        std::
        unordered_map<unsigned_long,_unsigned_int,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_int>_>_>
        ::erase(in_stack_fffffffffffffef0,
                (key_type *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
        std::
        vector<std::unordered_map<unsigned_long,_std::array<unsigned_int,_3UL>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::array<unsigned_int,_3UL>_>_>_>,_std::allocator<std::unordered_map<unsigned_long,_std::array<unsigned_int,_3UL>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::array<unsigned_int,_3UL>_>_>_>_>_>
        ::operator[]((vector<std::unordered_map<unsigned_long,_std::array<unsigned_int,_3UL>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::array<unsigned_int,_3UL>_>_>_>,_std::allocator<std::unordered_map<unsigned_long,_std::array<unsigned_int,_3UL>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::array<unsigned_int,_3UL>_>_>_>_>_>
                      *)(in_RDI + 8),(ulong)local_c);
        local_18._M_cur =
             (__node_type *)
             std::
             unordered_map<unsigned_long,_std::array<unsigned_int,_3UL>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::array<unsigned_int,_3UL>_>_>_>
             ::erase((unordered_map<unsigned_long,_std::array<unsigned_int,_3UL>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::array<unsigned_int,_3UL>_>_>_>
                      *)in_stack_fffffffffffffef0,in_stack_fffffffffffffef8._M_cur);
      }
      else if (vVar1 == 1) {
        std::async<void(ztimer::Timer::*)(),ztimer::Timer*&>
                  (in_stack_ffffffffffffff6c,in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
        std::future<void>::~future((future<void> *)0x17fd08);
        std::__detail::
        _Node_iterator<std::pair<const_unsigned_long,_std::array<unsigned_int,_3UL>_>,_false,_false>
        ::operator->((_Node_iterator<std::pair<const_unsigned_long,_std::array<unsigned_int,_3UL>_>,_false,_false>
                      *)0x17fd15);
        pvVar3 = std::array<unsigned_int,_3UL>::operator[]
                           ((array<unsigned_int,_3UL> *)in_stack_fffffffffffffef0,
                            CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
        vVar1 = *pvVar3;
        std::__detail::
        _Node_iterator<std::pair<const_unsigned_long,_std::array<unsigned_int,_3UL>_>,_false,_false>
        ::operator->((_Node_iterator<std::pair<const_unsigned_long,_std::array<unsigned_int,_3UL>_>,_false,_false>
                      *)0x17fd39);
        pvVar3 = std::array<unsigned_int,_3UL>::operator[]
                           ((array<unsigned_int,_3UL> *)in_stack_fffffffffffffef0,
                            CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
        *pvVar3 = vVar1;
        std::__detail::
        _Node_iterator<std::pair<const_unsigned_long,_std::array<unsigned_int,_3UL>_>,_false,_false>
        ::operator++((_Node_iterator<std::pair<const_unsigned_long,_std::array<unsigned_int,_3UL>_>,_false,_false>
                      *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8),0);
      }
      else if (vVar1 == 2) {
        std::__detail::
        _Node_iterator<std::pair<const_unsigned_long,_std::array<unsigned_int,_3UL>_>,_false,_false>
        ::operator->((_Node_iterator<std::pair<const_unsigned_long,_std::array<unsigned_int,_3UL>_>,_false,_false>
                      *)0x17fe4a);
        std::
        unordered_map<unsigned_long,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>_>_>
        ::operator[]((unordered_map<unsigned_long,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>_>_>
                      *)in_stack_fffffffffffffef0,
                     (key_type *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
        Now((TimerManager *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
        bVar2 = std::chrono::operator<=
                          ((time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                            *)in_stack_fffffffffffffef0,
                           (time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                            *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
        if (bVar2) {
          in_stack_ffffffffffffff60 = (type *)0x0;
          in_stack_ffffffffffffff58 = (Timer **)0x11;
          std::async<void(ztimer::Timer::*)(),ztimer::Timer*&>
                    (in_stack_ffffffffffffff6c,(type *)0x0,(Timer **)0x11);
          std::future<void>::~future((future<void> *)0x17fec7);
          in_stack_fffffffffffffef0 =
               (unordered_map<unsigned_long,_unsigned_int,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_int>_>_>
                *)(in_RDI + 0x20);
          std::__detail::
          _Node_iterator<std::pair<const_unsigned_long,_std::array<unsigned_int,_3UL>_>,_false,_false>
          ::operator->((_Node_iterator<std::pair<const_unsigned_long,_std::array<unsigned_int,_3UL>_>,_false,_false>
                        *)0x17fee2);
          std::
          unordered_map<unsigned_long,_unsigned_int,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_int>_>_>
          ::erase(in_stack_fffffffffffffef0,
                  (key_type *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
          in_stack_fffffffffffffef8._M_cur = (__node_type *)(in_RDI + 0x58);
          std::__detail::
          _Node_iterator<std::pair<const_unsigned_long,_std::array<unsigned_int,_3UL>_>,_false,_false>
          ::operator->((_Node_iterator<std::pair<const_unsigned_long,_std::array<unsigned_int,_3UL>_>,_false,_false>
                        *)0x17ff0a);
          std::
          unordered_map<unsigned_long,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>_>_>
          ::erase((unordered_map<unsigned_long,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>_>_>
                   *)in_stack_fffffffffffffef0,
                  (key_type *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
          std::
          vector<std::unordered_map<unsigned_long,_std::array<unsigned_int,_3UL>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::array<unsigned_int,_3UL>_>_>_>,_std::allocator<std::unordered_map<unsigned_long,_std::array<unsigned_int,_3UL>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::array<unsigned_int,_3UL>_>_>_>_>_>
          ::operator[]((vector<std::unordered_map<unsigned_long,_std::array<unsigned_int,_3UL>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::array<unsigned_int,_3UL>_>_>_>,_std::allocator<std::unordered_map<unsigned_long,_std::array<unsigned_int,_3UL>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::array<unsigned_int,_3UL>_>_>_>_>_>
                        *)(in_RDI + 8),(ulong)local_c);
          local_18._M_cur =
               (__node_type *)
               std::
               unordered_map<unsigned_long,_std::array<unsigned_int,_3UL>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::array<unsigned_int,_3UL>_>_>_>
               ::erase((unordered_map<unsigned_long,_std::array<unsigned_int,_3UL>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::array<unsigned_int,_3UL>_>_>_>
                        *)in_stack_fffffffffffffef0,in_stack_fffffffffffffef8._M_cur);
        }
        else {
          std::__detail::
          _Node_iterator<std::pair<const_unsigned_long,_std::array<unsigned_int,_3UL>_>,_false,_false>
          ::operator->((_Node_iterator<std::pair<const_unsigned_long,_std::array<unsigned_int,_3UL>_>,_false,_false>
                        *)0x17ff69);
          pvVar3 = std::array<unsigned_int,_3UL>::operator[]
                             ((array<unsigned_int,_3UL> *)in_stack_fffffffffffffef0,
                              CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
          in_stack_fffffffffffffeec = *pvVar3;
          std::__detail::
          _Node_iterator<std::pair<const_unsigned_long,_std::array<unsigned_int,_3UL>_>,_false,_false>
          ::operator->((_Node_iterator<std::pair<const_unsigned_long,_std::array<unsigned_int,_3UL>_>,_false,_false>
                        *)0x17ff8d);
          pvVar3 = std::array<unsigned_int,_3UL>::operator[]
                             ((array<unsigned_int,_3UL> *)in_stack_fffffffffffffef0,
                              CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
          *pvVar3 = in_stack_fffffffffffffeec;
          std::__detail::
          _Node_iterator<std::pair<const_unsigned_long,_std::array<unsigned_int,_3UL>_>,_false,_false>
          ::operator++((_Node_iterator<std::pair<const_unsigned_long,_std::array<unsigned_int,_3UL>_>,_false,_false>
                        *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8),0);
        }
      }
    }
    else {
      std::__detail::
      _Node_iterator<std::pair<const_unsigned_long,_std::array<unsigned_int,_3UL>_>,_false,_false>::
      operator++((_Node_iterator<std::pair<const_unsigned_long,_std::array<unsigned_int,_3UL>_>,_false,_false>
                  *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8),0);
    }
  }
  return;
}

Assistant:

void TimerManager::Turn(unsigned int pos)
    {
        for (auto iter = timeWheel[pos].begin(); iter != timeWheel[pos].end();) {
            if (iter->second[2]-- == 0) {
                Timer* timer = reinterpret_cast<Timer*>(iter->first);
                switch (static_cast<Mode>(iter->second[0])) {
                    case REL_LOOP: {
                        std::async(std::launch::async, &Timer::TimeOut, timer);  // 异步执行超时函数
                        iter->second[2] = iter->second[1];
                        iter++;
                    } break;
                    case REL_ONCE: {
                        std::async(std::launch::async, &Timer::TimeOut, timer);  // 异步执行超时函数
                        // 移除一次性相对定时器
                        timerMap.erase(iter->first);
                        iter = timeWheel[pos].erase(iter);
                    } break;
                    case ABS_ONCE: {
                        if (AbsTimerMap[iter->first] <= Now()) {
                            std::async(std::launch::async, &Timer::TimeOut, timer);  // 异步执行超时函数
                            // 移除绝对定时器
                            timerMap.erase(iter->first);
                            AbsTimerMap.erase(iter->first);
                            iter = timeWheel[pos].erase(iter);
                        }
                        else {
                            iter->second[2] = iter->second[1];
                            iter++;
                        }
                    }
                    default: break;
                }
            }
            else {
                iter++;
            }
        }
    }